

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O0

void __thiscall
TPZTensor<TFad<6,_double>_>::TPZTensor(TPZTensor<TFad<6,_double>_> *this,TPZDecomposed *eigensystem)

{
  uint *puVar1;
  TPZTensor<TFad<6,_double>_> *in_RSI;
  TPZSavable *in_RDI;
  uint i;
  double *in_stack_ffffffffffffff68;
  TFad<6,_double> *in_stack_ffffffffffffff70;
  uint local_68;
  TFad<6,_double> *in_stack_ffffffffffffffe0;
  TPZTensor<TFad<6,_double>_> *in_stack_ffffffffffffffe8;
  
  TPZSavable::TPZSavable(in_RDI,&PTR_PTR_02438e30);
  in_RDI->_vptr_TPZSavable = (_func_int **)&PTR__TPZTensor_02438de0;
  TFad<6,_double>::TFad(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  TPZManVector<TFad<6,_double>,_6>::TPZManVector
            ((TPZManVector<TFad<6,_double>,_6> *)in_RSI,(int64_t)in_stack_ffffffffffffffe8,
             in_stack_ffffffffffffffe0);
  TFad<6,_double>::~TFad((TFad<6,_double> *)0x14b549a);
  for (local_68 = 0; local_68 < 3; local_68 = *puVar1 + local_68) {
    TPZVec<TPZTensor<TFad<6,_double>_>_>::operator[]
              ((TPZVec<TPZTensor<TFad<6,_double>_>_> *)(in_RSI[2].fData.fExtAlloc[1].dx_ + 2),
               (ulong)local_68);
    TPZVec<TFad<6,_double>_>::operator[]
              ((TPZVec<TFad<6,_double>_> *)(in_RSI->fData).fExtAlloc[0].dx_,(ulong)local_68);
    TPZTensor<TFad<6,double>>::Add<TFad<6,double>,TFad<6,double>>
              (in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    puVar1 = TPZVec<unsigned_int>::operator[]
                       ((TPZVec<unsigned_int> *)&in_RSI->fData,(ulong)local_68);
  }
  return;
}

Assistant:

TPZTensor(const TPZDecomposed &eigensystem) : fData(6, T(0.)) {
        unsigned int i;
        for (i = 0; i < 3; i += eigensystem.fGeometricMultiplicity[i]) {
            Add(eigensystem.fEigentensors[i], eigensystem.fEigenvalues[i]);
        }
#ifdef PZDEBUG
        if (i != 3) {
            DebugStop();
        }
#endif
    }